

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFactoryRegistry.cpp
# Opt level: O0

TestFactoryRegistryList * CppUnit::TestFactoryRegistryList::getInstance(void)

{
  int iVar1;
  
  if (getInstance()::list == '\0') {
    iVar1 = __cxa_guard_acquire(&getInstance()::list);
    if (iVar1 != 0) {
      TestFactoryRegistryList(&getInstance::list);
      __cxa_atexit(~TestFactoryRegistryList,&getInstance::list,&__dso_handle);
      __cxa_guard_release(&getInstance()::list);
    }
  }
  return &getInstance::list;
}

Assistant:

static TestFactoryRegistryList *getInstance()
  {
    static TestFactoryRegistryList list;
    return &list;
  }